

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void P_ClearACSVars(bool alsoglobal)

{
  long lVar1;
  
  memset(ACS_WorldVars,0,0x400);
  for (lVar1 = 0; lVar1 != 0x1800; lVar1 = lVar1 + 0x18) {
    TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear
              ((TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)
               ((long)&ACS_WorldArrays[0].Nodes + lVar1),1);
  }
  if (alsoglobal) {
    memset(ACS_GlobalVars,0,0x100);
    for (lVar1 = 0; lVar1 != 0x600; lVar1 = lVar1 + 0x18) {
      TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear
                ((TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)
                 ((long)&ACS_GlobalArrays[0].Nodes + lVar1),1);
    }
    ACSStringPool::Clear(&GlobalACSStrings);
    return;
  }
  P_MarkGlobalVarStrings();
  ACSStringPool::PurgeStrings(&GlobalACSStrings);
  return;
}

Assistant:

void P_ClearACSVars(bool alsoglobal)
{
	int i;

	memset (ACS_WorldVars, 0, sizeof(ACS_WorldVars));
	for (i = 0; i < NUM_WORLDVARS; ++i)
	{
		ACS_WorldArrays[i].Clear ();
	}
	if (alsoglobal)
	{
		memset (ACS_GlobalVars, 0, sizeof(ACS_GlobalVars));
		for (i = 0; i < NUM_GLOBALVARS; ++i)
		{
			ACS_GlobalArrays[i].Clear ();
		}
		// Since we cleared all ACS variables, we know nothing refers to them
		// anymore.
		GlobalACSStrings.Clear();
	}
	else
	{
		// Purge any strings that aren't referenced by global variables, since
		// they're the only possible references left.
		P_MarkGlobalVarStrings();
		GlobalACSStrings.PurgeStrings();
	}
}